

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

void __thiscall
Lib::Set<Kernel::TermOrderingDiagram::Polynomial_*,_Lib::DerefPtrHash<Lib::DefaultHash>_>::Set
          (Set<Kernel::TermOrderingDiagram::Polynomial_*,_Lib::DerefPtrHash<Lib::DefaultHash>_>
           *this)

{
  undefined4 *in_RDI;
  Set<Kernel::TermOrderingDiagram::Polynomial_*,_Lib::DerefPtrHash<Lib::DefaultHash>_>
  *in_stack_00000030;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  expand(in_stack_00000030);
  return;
}

Assistant:

Set()
    : _capacity(0),
      _nonemptyCells(0),
      _size(0),
      _entries(0)
  {
    expand();
  }